

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

bool anon_unknown.dwarf_52317d::AddRevokedSerialU64(X509_CRL *crl,uint64_t serial,int offset_day)

{
  bool bVar1;
  int iVar2;
  X509_REVOKED *pXVar3;
  ASN1_INTEGER *__p;
  ASN1_TIME *__p_00;
  pointer paVar4;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_50;
  UniquePtr<ASN1_TIME> rev_date;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_38;
  UniquePtr<ASN1_INTEGER> serial_asn1;
  UniquePtr<X509_REVOKED> rev;
  int offset_day_local;
  uint64_t serial_local;
  X509_CRL *crl_local;
  
  pXVar3 = X509_REVOKED_new();
  std::unique_ptr<x509_revoked_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_revoked_st,bssl::internal::Deleter> *)&serial_asn1,(pointer)pXVar3);
  __p = ASN1_INTEGER_new();
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&local_38,(pointer)__p);
  __p_00 = ASN1_TIME_adj((ASN1_TIME *)0x0,0x57e9b680,offset_day,0);
  std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&local_50,(pointer)__p_00);
  bVar1 = std::operator==((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)&serial_asn1,
                          (nullptr_t)0x0);
  if (!bVar1) {
    bVar1 = std::operator==(&local_38,(nullptr_t)0x0);
    if (!bVar1) {
      bVar1 = std::operator==(&local_50,(nullptr_t)0x0);
      if (!bVar1) {
        paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_38);
        iVar2 = ASN1_INTEGER_set_uint64(paVar4,serial);
        if (iVar2 != 0) {
          pXVar3 = (X509_REVOKED *)
                   std::unique_ptr<x509_revoked_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)&serial_asn1);
          paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_38);
          iVar2 = X509_REVOKED_set_serialNumber(pXVar3,(ASN1_INTEGER *)paVar4);
          if (iVar2 != 0) {
            pXVar3 = (X509_REVOKED *)
                     std::unique_ptr<x509_revoked_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)&serial_asn1
                               );
            paVar4 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get(&local_50);
            iVar2 = X509_REVOKED_set_revocationDate(pXVar3,(ASN1_TIME *)paVar4);
            if (iVar2 != 0) {
              pXVar3 = (X509_REVOKED *)
                       std::unique_ptr<x509_revoked_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)
                                  &serial_asn1);
              iVar2 = X509_CRL_add0_revoked((X509_CRL *)crl,pXVar3);
              if (iVar2 != 0) {
                std::unique_ptr<x509_revoked_st,_bssl::internal::Deleter>::release
                          ((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)&serial_asn1);
                crl_local._7_1_ = true;
                goto LAB_00656f93;
              }
            }
          }
        }
      }
    }
  }
  crl_local._7_1_ = false;
LAB_00656f93:
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
  std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
  std::unique_ptr<x509_revoked_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_revoked_st,_bssl::internal::Deleter> *)&serial_asn1);
  return crl_local._7_1_;
}

Assistant:

static bool AddRevokedSerialU64(X509_CRL *crl, uint64_t serial,
                                int offset_day) {
  bssl::UniquePtr<X509_REVOKED> rev(X509_REVOKED_new());
  bssl::UniquePtr<ASN1_INTEGER> serial_asn1(ASN1_INTEGER_new());
  bssl::UniquePtr<ASN1_TIME> rev_date(
      ASN1_TIME_adj(nullptr, kReferenceTime, offset_day, /*offset_sec=*/0));
  if (rev == nullptr || serial_asn1 == nullptr || rev_date == nullptr ||
      !ASN1_INTEGER_set_uint64(serial_asn1.get(), serial) ||
      !X509_REVOKED_set_serialNumber(rev.get(), serial_asn1.get()) ||
      !X509_REVOKED_set_revocationDate(rev.get(), rev_date.get()) ||
      !X509_CRL_add0_revoked(crl, rev.get())) {
    return false;
  }
  rev.release();  // X509_CRL_add0_revoked takes ownership on success.
  return true;
}